

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistatstest.cpp
# Opt level: O2

void test_statisticstracker(void)

{
  string *this;
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  allocator<char> local_2e0 [36];
  StatisticsTrackerOptions local_2bc;
  string local_2a8;
  stringstream msg;
  ostream local_278 [376];
  StatisticsTracker tracker;
  
  local_2bc.histogramOptions.binCount = 100;
  local_2bc.histogramOptions.cacheSize = 1000;
  local_2bc.histogramOptions.enabled = false;
  local_2bc.doCov = true;
  local_2bc.doMax = true;
  local_2bc.doMean = true;
  local_2bc.doMin = true;
  local_2bc.doVar = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"test",(allocator<char> *)&msg);
  StatisticsTracker::StatisticsTracker(&tracker,&local_2a8,0,0.0,0.0,0.0,0.0,&local_2bc);
  std::__cxx11::string::~string((string *)&local_2a8);
  StatisticsTracker::update(&tracker,1.0);
  StatisticsTracker::update(&tracker,2.0);
  StatisticsTracker::update(&tracker,3.0);
  StatisticsTracker::update(&tracker,4.0);
  StatisticsTracker::update(&tracker,5.0);
  if (tracker._count != 5) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar2 = std::operator<<(local_278,"StatisticsTracker::getCount failed");
    std::endl<char,std::char_traits<char>>(poVar2);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_2e0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((tracker._minimum != 1.0) || (NAN(tracker._minimum))) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar2 = std::operator<<(local_278,"StatisticsTracker::getMin failed");
    std::endl<char,std::char_traits<char>>(poVar2);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_2e0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((tracker._mean != 3.0) || (NAN(tracker._mean))) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar2 = std::operator<<(local_278,"StatisticsTracker::getMean failed");
    std::endl<char,std::char_traits<char>>(poVar2);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_2e0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((tracker._maximum == 5.0) && (!NAN(tracker._maximum))) {
    this = &tracker._name;
    std::__cxx11::string::string((string *)&msg,(string *)this);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &msg,"test");
    std::__cxx11::string::~string((string *)&msg);
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
      poVar2 = std::operator<<(local_278,"StatisticsTracker::getName failed");
      std::endl<char,std::char_traits<char>>(poVar2);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_2e0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((tracker._variance == 2.0) && (!NAN(tracker._variance))) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&msg,"test2",local_2e0);
      std::__cxx11::string::_M_assign((string *)this,(string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::string::string((string *)&msg,(string *)this);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &msg,"test2");
      std::__cxx11::string::~string((string *)&msg);
      if (bVar1) {
        StatisticsTracker::~StatisticsTracker(&tracker);
        return;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
      poVar2 = std::operator<<(local_278,"StatisticsTracker::setName failed");
      std::endl<char,std::char_traits<char>>(poVar2);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_2e0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar2 = std::operator<<(local_278,"StatisticsTracker::getVariance failed");
    std::endl<char,std::char_traits<char>>(poVar2);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_2e0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar2 = std::operator<<(local_278,"StatisticsTracker::getMax failed");
  std::endl<char,std::char_traits<char>>(poVar2);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,(string *)local_2e0);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_statisticstracker()
{

    StatisticsTrackerOptions options;
    options.doCov = options.doMax = options.doMean = options.doMin = options.doVar = true;
    
    StatisticsTracker tracker("test", 0, 0, 0, 0, 0, options);
    tracker.update(1);
    tracker.update(2);
    tracker.update(3);
    tracker.update(4);
    tracker.update(5);

    ASSERT_EQUAL(tracker.getCount(), 5, "StatisticsTracker::getCount failed");
    ASSERT_EQUAL(tracker.getMinimum(), 1, "StatisticsTracker::getMin failed");
    ASSERT_EQUAL(tracker.getMean(), 3, "StatisticsTracker::getMean failed");
    ASSERT_EQUAL(tracker.getMaximum(), 5, "StatisticsTracker::getMax failed");
    ASSERT_EQUAL(tracker.getName(), "test", "StatisticsTracker::getName failed");
    ASSERT_EQUAL(tracker.getVariance(), 2, "StatisticsTracker::getVariance failed");
    
    tracker.setName("test2");
    ASSERT_EQUAL(tracker.getName(), "test2", "StatisticsTracker::setName failed");

}